

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void writeBasisFile(FILE **file,HighsBasis *basis)

{
  bool bVar1;
  size_type sVar2;
  reference pHVar3;
  byte *in_RSI;
  undefined8 *in_RDI;
  HighsBasisStatus *status_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *__range1_1;
  HighsBasisStatus *status;
  const_iterator __end1;
  const_iterator __begin1;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *__range1;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
  *in_stack_ffffffffffffffa0;
  FILE *pFVar4;
  __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
  local_40;
  byte *local_38;
  reference local_30;
  HighsBasisStatus *local_28;
  __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
  local_20;
  byte *local_18;
  byte *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  fprintf((FILE *)*in_RDI,"HiGHS v%d\n",1);
  if ((*local_10 & 1) == 0) {
    fprintf((FILE *)*local_8,"None\n");
  }
  else {
    fprintf((FILE *)*local_8,"Valid\n");
    pFVar4 = (FILE *)*local_8;
    sVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                       (local_10 + 0x30));
    fprintf(pFVar4,"# Columns %d\n",sVar2 & 0xffffffff);
    local_18 = local_10 + 0x30;
    local_20._M_current =
         (HighsBasisStatus *)
         std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::begin
                   (in_stack_ffffffffffffff98);
    local_28 = (HighsBasisStatus *)
               std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::end
                         (in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      local_30 = __gnu_cxx::
                 __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
                 ::operator*(&local_20);
      fprintf((FILE *)*local_8,"%d ",(ulong)*local_30);
      __gnu_cxx::
      __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
      ::operator++(&local_20);
    }
    fprintf((FILE *)*local_8,"\n");
    pFVar4 = (FILE *)*local_8;
    sVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                      ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                       (local_10 + 0x48));
    fprintf(pFVar4,"# Rows %d\n",sVar2 & 0xffffffff);
    local_38 = local_10 + 0x48;
    local_40._M_current =
         (HighsBasisStatus *)
         std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::begin
                   (in_stack_ffffffffffffff98);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::end(in_stack_ffffffffffffff98)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
                          *)pFVar4,
                         (__normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      pHVar3 = __gnu_cxx::
               __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
               ::operator*(&local_40);
      fprintf((FILE *)*local_8,"%d ",(ulong)*pHVar3);
      __gnu_cxx::
      __normal_iterator<const_HighsBasisStatus_*,_std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>_>
      ::operator++(&local_40);
    }
    fprintf((FILE *)*local_8,"\n");
  }
  return;
}

Assistant:

void writeBasisFile(FILE*& file, const HighsBasis& basis) {
  fprintf(file, "HiGHS v%d\n", (int)HIGHS_VERSION_MAJOR);
  if (basis.valid == false) {
    fprintf(file, "None\n");
    return;
  }
  fprintf(file, "Valid\n");
  fprintf(file, "# Columns %d\n", (int)basis.col_status.size());
  for (const auto& status : basis.col_status) fprintf(file, "%d ", (int)status);
  fprintf(file, "\n");
  fprintf(file, "# Rows %d\n", (int)basis.row_status.size());
  for (const auto& status : basis.row_status) fprintf(file, "%d ", (int)status);
  fprintf(file, "\n");
}